

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O1

void __thiscall
kj::StringTree::
fill<kj::ArrayPtr<char_const>,kj::CappedArray<char,8ul>,kj::ArrayPtr<char_const>,kj::StringPtr,kj::ArrayPtr<char_const>>
          (StringTree *this,char *pos,size_t branchIndex,ArrayPtr<const_char> *first,
          CappedArray<char,_8UL> *rest,ArrayPtr<const_char> *rest_1,StringPtr *rest_2,
          ArrayPtr<const_char> *rest_3)

{
  size_t sVar1;
  char *__src;
  size_t sVar2;
  
  sVar1 = first->size_;
  if (sVar1 != 0) {
    memcpy(pos,first->ptr,sVar1);
    pos = pos + sVar1;
  }
  sVar1 = rest->currentSize;
  if (sVar1 != 0) {
    memcpy(pos,rest->content,sVar1);
    pos = pos + sVar1;
  }
  sVar1 = rest_1->size_;
  if (sVar1 != 0) {
    memcpy(pos,rest_1->ptr,sVar1);
    pos = pos + sVar1;
  }
  __src = (rest_2->content).ptr;
  sVar2 = (rest_2->content).size_;
  if (__src != __src + (sVar2 - 1)) {
    memcpy(pos,__src,sVar2 - 1);
    pos = pos + (sVar2 - 1);
  }
  if (rest_3->size_ != 0) {
    memcpy(pos,rest_3->ptr,rest_3->size_);
    return;
  }
  return;
}

Assistant:

void StringTree::fill(char* pos, size_t branchIndex, First&& first, Rest&&... rest) {
  pos = _::fill(pos, kj::fwd<First>(first));
  fill(pos, branchIndex, kj::fwd<Rest>(rest)...);
}